

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O2

int AF_A_FireMissile(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  AWeapon *this_00;
  bool bVar2;
  void *pvVar3;
  PClassActor *type;
  AActor *source;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005213b5;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005213a5;
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_005212c5;
    bVar2 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005213b5;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_005213a5;
LAB_005212c5:
    source = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005213a5:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005213b5;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005213b5;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_005213a5;
    }
    if ((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar3 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_00521349;
        if (pvVar3 == (void *)0x0) goto LAB_00521347;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005213b5:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x1cb,"int AF_A_FireMissile(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_00521347:
  pvVar3 = (void *)0x0;
LAB_00521349:
  if (source->player != (player_t *)0x0) {
    this_00 = source->player->ReadyWeapon;
    if (((pvVar3 != (void *)0x0 && this_00 != (AWeapon *)0x0) && (*(int *)((long)pvVar3 + 8) == 1))
       && (bVar2 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,1), !bVar2)) {
      return 0;
    }
    type = PClass::FindActor("Rocket");
    P_SpawnPlayerMissile(source,type);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireMissile)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;
	}
	P_SpawnPlayerMissile (self, PClass::FindActor("Rocket"));
	return 0;
}